

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_convert_tile_tsbyte
              (fitsfile *outfptr,void *tiledata,long tilelen,int nullcheck,void *nullflagval,
              int nullval,int zbitpix,double scale,double zero,int *intlength,int *status)

{
  char cVar1;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  char *in_R8;
  undefined4 in_R9D;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  char *sbbuff;
  long ii;
  int *idata;
  int *in_stack_00000018;
  int flagval;
  undefined8 local_60;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  if (((((int)ii != 8) || (in_XMM0_Qa != 1.0)) || (NAN(in_XMM0_Qa))) ||
     ((in_XMM1_Qa != -128.0 || (NAN(in_XMM1_Qa))))) {
    ffpmsg((char *)0x1eec9f);
    *in_stack_00000018 = 0x19d;
    local_4 = 0x19d;
  }
  else {
    if (((*(int *)(*(long *)(in_RDI + 8) + 0x43c) == 0xb) ||
        (*(int *)(*(long *)(in_RDI + 8) + 0x43c) == 0x15)) ||
       ((*(int *)(*(long *)(in_RDI + 8) + 0x43c) == 0x16 ||
        (*(int *)(*(long *)(in_RDI + 8) + 0x43c) == 0x33)))) {
      *idata = 1;
      if (in_ECX == 1) {
        cVar1 = *in_R8;
        for (local_60 = in_RDX + -1; -1 < local_60; local_60 = local_60 + -1) {
          if (*(char *)(in_RSI + local_60) == cVar1) {
            *(char *)(in_RSI + local_60) = (char)in_R9D;
          }
          else {
            *(byte *)(in_RSI + local_60) = *(byte *)(in_RSI + local_60) ^ 0x80;
          }
        }
      }
      else {
        for (local_60 = in_RDX + -1; -1 < local_60; local_60 = local_60 + -1) {
          *(byte *)(in_RSI + local_60) = *(byte *)(in_RSI + local_60) ^ 0x80;
        }
      }
    }
    else {
      *idata = 4;
      if (in_ECX == 1) {
        cVar1 = *in_R8;
        for (local_60 = in_RDX + -1; -1 < local_60; local_60 = local_60 + -1) {
          if (*(char *)(in_RSI + local_60) == cVar1) {
            *(undefined4 *)(in_RSI + local_60 * 4) = in_R9D;
          }
          else {
            *(int *)(in_RSI + local_60 * 4) = *(char *)(in_RSI + local_60) + 0x80;
          }
        }
      }
      else {
        fits_sbyte_to_int_inplace
                  ((char *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),(long)in_R8,
                   (int *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8));
      }
    }
    local_4 = *in_stack_00000018;
  }
  return local_4;
}

Assistant:

int imcomp_convert_tile_tsbyte(
    fitsfile *outfptr,
    void *tiledata, 
    long tilelen,
    int nullcheck,
    void *nullflagval,
    int nullval,
    int zbitpix,
    double scale,
    double zero,
    int *intlength,
    int *status)
{
    /*  Prepare the input tile array of pixels for compression. */
    /*  Convert input integer*1 tile array in place to 4 or 8-byte ints for compression, */
    /*  If needed, convert 4 or 8-byte ints and do null value substitution. */
    /*  Note that the calling routine must have allocated the input array big enough */
    /* to be able to do this.  */

    int flagval, *idata;
    long ii;
    signed char *sbbuff;

       /* datatype of input array is signed byte.  We only support writing this datatype
          to a FITS image with BITPIX = 8 and with BZERO = 0 and BSCALE = -128.  */

       if (zbitpix != BYTE_IMG|| scale != 1.0 || zero != -128.) {
           ffpmsg("Implicit datatype conversion is not supported when writing to compressed images");
           return(*status = DATA_COMPRESSION_ERR);
       }

       idata = (int *) tiledata;
       sbbuff = (signed char *) tiledata;

       if ( (outfptr->Fptr)->compress_type == RICE_1 || (outfptr->Fptr)->compress_type == GZIP_1
         || (outfptr->Fptr)->compress_type == GZIP_2 || (outfptr->Fptr)->compress_type == BZIP2_1 ) 
       {
           /* don't have to convert to int if using gzip, bzip2 or Rice compression */
           *intlength = 1;
             
           if (nullcheck == 1) {
               /* reset pixels equal to flagval to the FITS null value, prior to compression */
               /* offset the other pixel values (by flipping the MSB) */

               flagval = *(signed char *) (nullflagval);
               for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (sbbuff[ii] == (signed char) flagval)
		       sbbuff[ii] = (signed char) nullval;
                    else
		       sbbuff[ii] = (sbbuff[ii]) ^ 0x80;               }
           } else {  /* just offset the pixel values (by flipping the MSB) */
               for (ii = tilelen - 1; ii >= 0; ii--) 
		       sbbuff[ii] = (sbbuff[ii]) ^ 0x80;
           }

       } else {
           /* have to convert to int if using HCOMPRESS or PLIO */
           *intlength = 4;

           if (nullcheck == 1) {
               /* reset pixels equal to flagval to the FITS null value, prior to compression */
               flagval = *(signed char *) (nullflagval);
               for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (sbbuff[ii] == (signed char) flagval)
		       idata[ii] = nullval;
                    else
                       idata[ii] = ((int) sbbuff[ii]) + 128;
               }
           } else {  /* just do the data type conversion to int */
                 /* have to convert sbbuff to an I*4 array, in place */
                 /* sbbuff must have been allocated large enough to do this */
                 fits_sbyte_to_int_inplace(sbbuff, tilelen, status);
           }
       }
 
       return(*status);
}